

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

void __thiscall
wallet::coinselector_tests::SelectCoins_effective_value_test::test_method
          (SelectCoins_effective_value_test *this)

{
  uchar *puVar1;
  pointer pCVar2;
  PreselectedInput *this_00;
  Result<wallet::PreSelectedInputs> *this_01;
  T *__x;
  mapped_type *pmVar3;
  undefined8 uVar4;
  long lVar5;
  NodeContext *wallet_name;
  undefined8 *puVar6;
  CAmount *nTargetValue;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *coin_control;
  long in_FS_OFFSET;
  byte bVar7;
  const_string file;
  const_string msg;
  CAmount target;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  Result<wallet::SelectionResult> result;
  T preset_inputs;
  COutput output;
  CCoinControl cc;
  FastRandomContext rand;
  CoinsResult available_coins;
  check_type cVar8;
  undefined4 in_stack_fffffffffffffae4;
  int in_stack_fffffffffffffae8;
  char *local_508;
  char *local_500;
  assertion_result local_4f8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 local_4ba;
  undefined1 local_4b9;
  CAmount local_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0;
  undefined1 local_498 [16];
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_488;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_480;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> _Stack_478;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_470;
  __uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> local_468;
  __uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_> local_460;
  __uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> local_458;
  int local_450;
  undefined3 uStack_44c;
  _Optional_payload_base<int> local_448;
  _Variadic_union<bilingual_str,_wallet::SelectionResult> local_440;
  char local_3d0;
  undefined1 local_3c8 [16];
  thread local_3b8;
  char **ppcStack_3b0;
  uint32_t local_3a8;
  undefined1 local_3a4 [12];
  PreSelectedInputs local_398;
  undefined1 local_360 [64];
  undefined4 local_320;
  CTxOut local_318;
  BaseIndex *local_2f0;
  BaseIndex *pBStack_2e8;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> local_2e0;
  BaseIndex *pBStack_2d8;
  BaseIndex *local_2d0;
  BaseIndex *pBStack_2c8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_2c0;
  undefined1 local_267;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_230;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_200;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_1d0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_1a0;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_170;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  local_128;
  FastRandomContext local_f0;
  CoinsResult local_68;
  long local_20;
  
  bVar7 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = local_2c0._M_first._M_storage._M_storage + 0x10;
  local_2c0._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  wallet_name = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node;
  NewWallet((NodeContext *)local_4b0,(string *)wallet_name);
  if ((uchar *)local_2c0._0_8_ != puVar1) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.total_amount = 0;
  local_68.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  local_68.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  local_2c0._0_8_ = puVar1;
  local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"dummy","");
  NewWallet((NodeContext *)local_360,(string *)wallet_name);
  if ((uchar *)local_2c0._0_8_ != puVar1) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  local_2c0._0_8_ = 100000;
  cVar8 = CHECK_PRED;
  add_coin(&local_68,(CWallet *)local_360._0_8_,(CAmount *)&local_2c0,(CFeeRate)0x0,0x90,false,0,
           false,in_stack_fffffffffffffae8);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)local_360);
  local_4b8 = 0x1863c;
  FastRandomContext::FastRandomContext(&local_f0,false);
  local_498._8_8_ = (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x9400000022;
  local_488._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       (_Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>)0x3e8;
  local_480._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
       (_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>)0x0;
  _Stack_478._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
       (_Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)0x0;
  local_470._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)0x0;
  local_468._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)
       (_Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>)0xbb8;
  local_460._M_t.
  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
  super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl =
       (tuple<ChainstateManager_*,_std::default_delete<ChainstateManager>_>)
       (_Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>)0x3e8;
  local_458._M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (tuple<BanMan_*,_std::default_delete<BanMan>_>)
       (_Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>)0x3e8;
  local_448._M_payload = (_Storage<int,_true>)0x0;
  local_448._M_engaged = false;
  local_448._5_3_ = 0;
  local_450 = 0;
  uStack_44c._0_1_ = false;
  uStack_44c._1_1_ = false;
  uStack_44c._2_1_ = false;
  local_498._0_8_ = &local_f0;
  CCoinControl::CCoinControl((CCoinControl *)&local_2c0._M_first);
  local_267 = 0;
  CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&local_440._M_first,
                   &local_68);
  if (local_440._8_8_ == local_440._0_8_) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                        &local_440._M_first);
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_398);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)(local_4b0 + 8));
      if (0x1c < local_318.scriptPubKey.super_CScriptBase._size) {
        free(local_318.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        local_318.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      CCoinControl::~CCoinControl((CCoinControl *)&local_2c0._M_first);
      ChaCha20::~ChaCha20(&local_f0.rng);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                   *)&local_68);
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)local_4b0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        _Unwind_Resume(uVar4);
      }
    }
  }
  else {
    uVar4 = local_440._0_8_;
    puVar6 = (undefined8 *)local_360;
    for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar6 = *(BaseIndex **)uVar4;
      uVar4 = (pointer)(uVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    local_320 = *(undefined4 *)(local_440._0_8_ + 0x40);
    local_318.nValue =
         *(CAmount *)
          &((__uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> *)
           (local_440._0_8_ + 0x48))->_M_t;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&local_318.scriptPubKey.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_440._0_8_ + 0x50));
    local_2f0 = *(pointer)(local_440._0_8_ + 0x70);
    pBStack_2e8 = *(pointer)(local_440._0_8_ + 0x78);
    local_2e0._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         *(tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_> *)
          (local_440._0_8_ + 0x80);
    pBStack_2d8 = *(pointer)(local_440._0_8_ + 0x88);
    local_2d0 = *(pointer)(local_440._0_8_ + 0x90);
    pBStack_2c8 = *(pointer)(local_440._0_8_ + 0x98);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&local_440._M_first);
    CCoinControl::SetInputWeight
              ((CCoinControl *)&local_2c0._M_first,(COutPoint *)(local_360 + 0x20),0x94);
    this_00 = CCoinControl::Select
                        ((CCoinControl *)&local_2c0._M_first,(COutPoint *)(local_360 + 0x20));
    PreselectedInput::SetTxOut(this_00,&local_318);
    local_4b0._8_8_ = local_4b0._0_8_ + 0x1e8;
    local_4a0 = 0;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)(local_4b0 + 8));
    FetchSelectedInputs((Result<wallet::PreSelectedInputs> *)&local_440._M_first,
                        (CWallet *)local_4b0._0_8_,(CCoinControl *)&local_2c0._M_first,
                        (CoinSelectionParams *)local_498);
    this_01 = inline_assertion_check<true,util::Result<wallet::PreSelectedInputs>>
                        ((Result<wallet::PreSelectedInputs> *)&local_440._M_first,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                         ,0x60c,"test_method","FetchSelectedInputs(*wallet, cc, cs_params)");
    __x = util::Result<wallet::PreSelectedInputs>::value(this_01);
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)&local_398,
               (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)__x);
    local_398.total_amount = __x->total_amount;
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs> *)
                      &local_440._M_first);
    local_508 = (char *)CONCAT44(local_508._4_4_,2);
    pmVar3 = std::
             map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             ::operator[](&local_68.coins,(key_type *)&local_508);
    pCVar2 = (pmVar3->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)._M_impl
             .super__Vector_impl_data._M_start;
    local_3a8 = (pCVar2->outpoint).n;
    local_3c8._0_8_ = *(undefined8 *)&(pCVar2->outpoint).hash.m_wrapped.super_base_blob<256U>;
    local_3c8._8_8_ = *(undefined8 *)((long)&(pCVar2->outpoint).hash.m_wrapped + 8);
    local_3b8._M_id._M_thread = *(id *)((long)&(pCVar2->outpoint).hash.m_wrapped + 0x10);
    ppcStack_3b0 = *(char ***)((long)&(pCVar2->outpoint).hash.m_wrapped + 0x18);
    SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&local_4f8,false);
    std::
    _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<COutPoint_const*>
              ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_440,local_3c8,local_3a4,0,&local_4f8,&local_4b9,&local_4ba);
    CoinsResult::Erase(&local_68,
                       (unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                        *)&local_440._M_first);
    std::
    _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_440._M_first);
    nTargetValue = &local_4b8;
    coin_control = &local_2c0;
    SelectCoins((Result<wallet::SelectionResult> *)&local_440._M_first,(CWallet *)local_4b0._0_8_,
                &local_68,&local_398,nTargetValue,(CCoinControl *)&coin_control->_M_first,
                (CoinSelectionParams *)local_498);
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_4c8 = "";
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x610;
    file.m_begin = (iterator)&local_4d0;
    msg.m_end = (iterator)coin_control;
    msg.m_begin = (iterator)nTargetValue;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4e0,msg);
    local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_3d0 != '\x01');
    local_4f8.m_message.px = (element_type *)0x0;
    local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_508 = "!result";
    local_500 = "";
    local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
    local_3c8._0_8_ = &PTR__lazy_ostream_013abc70;
    local_3b8._M_id._M_thread = (id)boost::unit_test::lazy_ostream::inst;
    ppcStack_3b0 = &local_508;
    boost::test_tools::tt_detail::report_assertion
              (&local_4f8,(lazy_ostream *)local_3c8,1,0,WARN,
               CONCAT44(in_stack_fffffffffffffae4,cVar8),(size_t)&stack0xfffffffffffffae8,0x610);
    boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                      &local_440._M_first);
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)&local_398);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)(local_4b0 + 8));
    if (0x1c < local_318.scriptPubKey.super_CScriptBase._size) {
      free(local_318.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      local_318.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::~_Rb_tree(&local_128);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_170);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_1a0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_1d0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_200);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_230);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_2c0._M_first);
    ChaCha20::~ChaCha20(&local_f0.rng);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&local_68);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)local_4b0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_effective_value_test)
{
    // Test that the effective value is used to check whether preset inputs provide sufficient funds when subtract_fee_outputs is not used.
    // This test creates a coin whose value is higher than the target but whose effective value is lower than the target.
    // The coin is selected using coin control, with m_allow_other_inputs = false. SelectCoins should fail due to insufficient funds.

    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");
        add_coin(available_coins, *dummyWallet, 100000); // 0.001 BTC
    }

    CAmount target{99900}; // 0.000999 BTC

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/148,
        /*min_change_target=*/1000,
        /*effective_feerate=*/CFeeRate(3000),
        /*long_term_feerate=*/CFeeRate(1000),
        /*discard_feerate=*/CFeeRate(1000),
        /*tx_noinputs_size=*/0,
        /*avoid_partial=*/false,
    };
    CCoinControl cc;
    cc.m_allow_other_inputs = false;
    COutput output = available_coins.All().at(0);
    cc.SetInputWeight(output.outpoint, 148);
    cc.Select(output.outpoint).SetTxOut(output.txout);

    LOCK(wallet->cs_wallet);
    const auto preset_inputs = *Assert(FetchSelectedInputs(*wallet, cc, cs_params));
    available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

    const auto result = SelectCoins(*wallet, available_coins, preset_inputs, target, cc, cs_params);
    BOOST_CHECK(!result);
}